

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O1

bool remote::WriteProcessMemory
               (Handle hProcess,void *lpBaseAddress,void *lpBuffer,size_t nSize,
               size_t *lpNumberOfBytesWritten)

{
  bool bVar1;
  size_t sVar2;
  iovec local [1];
  Region reg;
  Handle local_cc;
  void *local_c8;
  size_t local_c0;
  void *local_b8;
  size_t local_b0;
  Region local_a8;
  
  local_cc.pid = hProcess.pid;
  bVar1 = Handle::IsRunning(&local_cc);
  if (bVar1) {
    Handle::GetRegionByAddress(&local_a8,&local_cc,(size_t)lpBaseAddress);
    if (local_a8.start + local_a8.end == 0) {
      bVar1 = false;
    }
    else {
      bVar1 = false;
      local_c8 = lpBaseAddress;
      local_c0 = nSize;
      local_b8 = lpBuffer;
      local_b0 = nSize;
      sVar2 = process_vm_writev(hProcess.pid,&local_b8,1,&local_c8,1,0);
      if (sVar2 != 0xffffffffffffffff) {
        if (lpNumberOfBytesWritten != (size_t *)0x0) {
          *lpNumberOfBytesWritten = sVar2;
        }
        bVar1 = sVar2 == nSize;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.filename._M_dataplus._M_p != &local_a8.filename.field_2) {
      operator_delete(local_a8.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.pathname._M_dataplus._M_p != &local_a8.pathname.field_2) {
      operator_delete(local_a8.pathname._M_dataplus._M_p);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool remote::WriteProcessMemory(Handle hProcess, void* lpBaseAddress, void* lpBuffer, size_t nSize, size_t* lpNumberOfBytesWritten) {
    if(!hProcess.IsRunning())
        return false;

    // Try to prevent them reading or writing to invalid memory
    Region reg = hProcess.GetRegionByAddress((size_t) lpBaseAddress);

    if(reg.start + reg.end == 0)
        return false;

    ssize_t result = hProcess.WriteMemory(lpBaseAddress, lpBuffer, nSize);

    if(result == -1)
        return false;

    if(lpNumberOfBytesWritten)
        *lpNumberOfBytesWritten = (size_t) result;

    return (((size_t) result) == nSize);
}